

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.h
# Opt level: O0

void __thiscall HighsLp::HighsLp(HighsLp *this,HighsLp *param_2)

{
  HighsLpMods *in_RSI;
  HighsLpMods *in_RDI;
  
  (((_Vector_base<double,_std::allocator<double>_> *)&in_RDI->save_non_semi_variable_index)->_M_impl
  ).super__Vector_impl_data._M_start =
       (((_Vector_base<double,_std::allocator<double>_> *)&in_RSI->save_non_semi_variable_index)->
       _M_impl).super__Vector_impl_data._M_start;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_RSI,
             (vector<double,_std::allocator<double>_> *)in_RDI);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_RSI,
             (vector<double,_std::allocator<double>_> *)in_RDI);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_RSI,
             (vector<double,_std::allocator<double>_> *)in_RDI);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_RSI,
             (vector<double,_std::allocator<double>_> *)in_RDI);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_RSI,
             (vector<double,_std::allocator<double>_> *)in_RDI);
  HighsSparseMatrix::HighsSparseMatrix((HighsSparseMatrix *)in_RSI,(HighsSparseMatrix *)in_RDI);
  (in_RDI->save_inf_cost_variable_cost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (in_RSI->save_inf_cost_variable_cost).super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (in_RDI->save_inf_cost_variable_cost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (in_RSI->save_inf_cost_variable_cost).super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string
            ((string *)
             &(in_RDI->save_inf_cost_variable_cost).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,
             (string *)
             &(in_RSI->save_inf_cost_variable_cost).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::__cxx11::string::string
            ((string *)&in_RDI->save_inf_cost_variable_upper,
             (string *)&in_RSI->save_inf_cost_variable_upper);
  (((_Vector_base<double,_std::allocator<double>_> *)&in_RDI[1].save_non_semi_variable_index)->
  _M_impl).super__Vector_impl_data._M_finish =
       (((_Vector_base<double,_std::allocator<double>_> *)&in_RSI[1].save_non_semi_variable_index)->
       _M_impl).super__Vector_impl_data._M_finish;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RSI,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RDI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RSI,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RDI);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)in_RSI,
             (vector<HighsVarType,_std::allocator<HighsVarType>_> *)in_RDI);
  HighsNameHash::HighsNameHash((HighsNameHash *)in_RSI,(HighsNameHash *)in_RDI);
  HighsNameHash::HighsNameHash((HighsNameHash *)in_RSI,(HighsNameHash *)in_RDI);
  in_RDI[1].save_tightened_semi_variable_upper_bound_value.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       in_RSI[1].save_tightened_semi_variable_upper_bound_value.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  HighsScale::HighsScale((HighsScale *)in_RSI,(HighsScale *)in_RDI);
  in_RDI[1].save_inf_cost_variable_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       in_RSI[1].save_inf_cost_variable_lower.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  *(undefined1 *)
   &in_RDI[1].save_inf_cost_variable_upper.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_start =
       *(undefined1 *)
        &in_RSI[1].save_inf_cost_variable_upper.super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_start;
  HighsLpMods::HighsLpMods(in_RSI,in_RDI);
  return;
}

Assistant:

HighsLp() { clear(); }